

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O0

EVdfg_stone INT_EVdfg_create_stone(EVdfg dfg,char *action)

{
  uint uVar1;
  EVdfg_stone p_Var2;
  EVdfg_stone *pp_Var3;
  char *in_RSI;
  EVdfg in_RDI;
  EVdfg_config_action act;
  EVdfg_stone stone;
  int in_stack_000000e4;
  EVdfg_configuration in_stack_000000e8;
  undefined1 in_stack_00000100 [32];
  size_t in_stack_ffffffffffffff98;
  void *in_stack_ffffffffffffffa0;
  
  p_Var2 = (EVdfg_stone)INT_CMmalloc((size_t)in_stack_ffffffffffffffa0);
  p_Var2->dfg = in_RDI;
  uVar1 = in_RDI->stone_count;
  in_RDI->stone_count = uVar1 + 1;
  p_Var2->stone_id = uVar1 | 0x80000000;
  if (in_RSI != (char *)0x0) {
    strdup(in_RSI);
  }
  pp_Var3 = (EVdfg_stone *)INT_CMrealloc(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  in_RDI->stones = pp_Var3;
  in_RDI->stones[in_RDI->stone_count + -1] = p_Var2;
  EVdfg_perform_act_on_state
            (in_stack_000000e8,(EVdfg_config_action)in_stack_00000100,in_stack_000000e4);
  return p_Var2;
}

Assistant:

EVdfg_stone
INT_EVdfg_create_stone(EVdfg dfg, char *action)
{
    EVdfg_stone stone = malloc(sizeof(struct _EVdfg_stone));
    EVdfg_config_action act;
    stone->dfg = dfg;
    stone->stone_id = 0x80000000 | dfg->stone_count++;
    act.type = ACT_create;
    act.stone_id = stone->stone_id;
    act.u.create.action = action ? strdup(action) : NULL;
    dfg->stones = realloc(dfg->stones, sizeof(dfg->stones[0]) * dfg->stone_count);
    dfg->stones[dfg->stone_count-1] = stone;
    EVdfg_perform_act_on_state(dfg->working_state, act, 1 /* add to queue */);
    return stone;
}